

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Schedules.cpp
# Opt level: O1

void CASC::Schedules::getSnakeTptpSatSchedule(Property *property,Schedule *quick)

{
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff1a0;
  allocator<char> local_e46;
  allocator<char> local_e45;
  allocator<char> local_e44;
  allocator<char> local_e43;
  allocator<char> local_e42;
  allocator<char> local_e41;
  allocator<char> local_e40;
  allocator<char> local_e3f;
  allocator<char> local_e3e;
  allocator<char> local_e3d;
  allocator<char> local_e3c;
  allocator<char> local_e3b;
  allocator<char> local_e3a;
  allocator<char> local_e39;
  allocator<char> local_e38;
  allocator<char> local_e37;
  allocator<char> local_e36;
  allocator<char> local_e35;
  allocator<char> local_e34;
  allocator<char> local_e33;
  allocator<char> local_e32;
  allocator<char> local_e31;
  allocator<char> local_e30;
  allocator<char> local_e2f;
  allocator<char> local_e2e;
  allocator<char> local_e2d;
  allocator<char> local_e2c;
  allocator<char> local_e2b;
  allocator<char> local_e2a;
  allocator<char> local_e29;
  allocator<char> local_e28;
  allocator<char> local_e27;
  allocator<char> local_e26;
  allocator<char> local_e25;
  allocator<char> local_e24;
  allocator<char> local_e23;
  allocator<char> local_e22;
  allocator<char> local_e21;
  allocator<char> local_e20;
  allocator<char> local_e1f;
  allocator<char> local_e1e;
  allocator<char> local_e1d;
  allocator<char> local_e1c;
  allocator<char> local_e1b;
  allocator<char> local_e1a;
  allocator<char> local_e19;
  allocator<char> local_e18;
  allocator<char> local_e17;
  allocator<char> local_e16;
  allocator<char> local_e15;
  allocator<char> local_e14;
  allocator<char> local_e13;
  allocator<char> local_e12;
  allocator<char> local_e11;
  allocator<char> local_e10;
  allocator<char> local_e0f;
  allocator<char> local_e0e;
  allocator<char> local_e0d;
  allocator<char> local_e0c;
  allocator<char> local_e0b;
  allocator<char> local_e0a;
  allocator<char> local_e09;
  allocator<char> local_e08;
  allocator<char> local_e07;
  allocator<char> local_e06;
  allocator<char> local_e05;
  allocator<char> local_e04;
  allocator<char> local_e03;
  allocator<char> local_e02;
  allocator<char> local_e01;
  allocator<char> local_e00;
  allocator<char> local_dff;
  allocator<char> local_dfe;
  allocator<char> local_dfd;
  allocator<char> local_dfc;
  allocator<char> local_dfb;
  allocator<char> local_dfa;
  allocator<char> local_df9;
  allocator<char> local_df8;
  allocator<char> local_df7;
  allocator<char> local_df6;
  allocator<char> local_df5;
  allocator<char> local_df4;
  allocator<char> local_df3;
  allocator<char> local_df2;
  allocator<char> local_df1;
  allocator<char> local_df0;
  allocator<char> local_def;
  allocator<char> local_dee;
  allocator<char> local_ded;
  allocator<char> local_dec;
  allocator<char> local_deb;
  allocator<char> local_dea;
  allocator<char> local_de9;
  allocator<char> local_de8;
  allocator<char> local_de7;
  allocator<char> local_de6;
  allocator<char> local_de5;
  allocator<char> local_de4;
  allocator<char> local_de3;
  allocator<char> local_de2;
  allocator<char> local_de1;
  allocator<char> local_de0;
  allocator<char> local_ddf;
  allocator<char> local_dde;
  allocator<char> local_ddd;
  allocator<char> local_ddc;
  allocator<char> local_ddb;
  allocator<char> local_dda;
  allocator<char> local_dd9;
  string local_dd8 [32];
  string local_db8 [32];
  string local_d98 [32];
  string local_d78 [32];
  string local_d58 [32];
  string local_d38 [32];
  string local_d18 [32];
  string local_cf8 [32];
  string local_cd8 [32];
  string local_cb8 [32];
  string local_c98 [32];
  string local_c78 [32];
  string local_c58 [32];
  string local_c38 [32];
  string local_c18 [32];
  string local_bf8 [32];
  string local_bd8 [32];
  string local_bb8 [32];
  string local_b98 [32];
  string local_b78 [32];
  string local_b58 [32];
  string local_b38 [32];
  string local_b18 [32];
  string local_af8 [32];
  string local_ad8 [32];
  string local_ab8 [32];
  string local_a98 [32];
  string local_a78 [32];
  string local_a58 [32];
  string local_a38 [32];
  string local_a18 [32];
  string local_9f8 [32];
  string local_9d8 [32];
  string local_9b8 [32];
  string local_998 [32];
  string local_978 [32];
  string local_958 [32];
  string local_938 [32];
  string local_918 [32];
  string local_8f8 [32];
  string local_8d8 [32];
  string local_8b8 [32];
  string local_898 [32];
  string local_878 [32];
  string local_858 [32];
  string local_838 [32];
  string local_818 [32];
  string local_7f8 [32];
  string local_7d8 [32];
  string local_7b8 [32];
  string local_798 [32];
  string local_778 [32];
  string local_758 [32];
  string local_738 [32];
  string local_718 [32];
  string local_6f8 [32];
  string local_6d8 [32];
  string local_6b8 [32];
  string local_698 [32];
  string local_678 [32];
  string local_658 [32];
  string local_638 [32];
  string local_618 [32];
  string local_5f8 [32];
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598 [32];
  string local_578 [32];
  string local_558 [32];
  string local_538 [32];
  string local_518 [32];
  string local_4f8 [32];
  string local_4d8 [32];
  string local_4b8 [32];
  string local_498 [32];
  string local_478 [32];
  string local_458 [32];
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,
             "fmb+10_1:1_drc=ordering:bce=on:fmbsr=1.5:nm=4:i=191324:si=on:rawr=on:rtra=on_0",
             &local_dd9);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_dd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,
             "ott+10_1:32_drc=ordering:abs=on:br=off:urr=ec_only:i=50:si=on:rawr=on:rtra=on_0",
             &local_dda);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_dda);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,
             "ott+4_1:1_drc=ordering:av=off:bd=off:nwc=5.0:s2a=on:s2at=2.0:slsq=on:slsqc=2:slsql=off:slsqr=1,2:sp=frequency:i=37:si=on:rawr=on:rtra=on_0"
             ,&local_ddb);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_ddb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,
             "ott+10_1:32_drc=ordering:bd=off:fsr=off:newcnf=on:tgt=full:i=51:si=on:rawr=on:rtra=on_0"
             ,&local_ddc);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_ddc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8,"ott+33_1:4_drc=ordering:s2a=on:tgt=ground:i=51:si=on:rawr=on:rtra=on_0",
             &local_ddd);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_ddd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8,
             "dis+34_1:32_drc=ordering:abs=on:add=off:bsr=on:gsp=on:sp=weighted_frequency:i=48:si=on:rawr=on:rtra=on_0"
             ,&local_dde);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_dde);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"fmb+10_1:1_drc=ordering:fmbsr=2.0:nm=4:i=51:si=on:rawr=on:rtra=on_0",
             &local_ddf);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_ddf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_118,"dis+10_1:1_drc=ordering:fsd=on:sp=occurrence:i=7:si=on:rawr=on:rtra=on_0",
             &local_de0);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_de0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"dis+2_1:64_drc=ordering:add=large:bce=on:bd=off:i=2:si=on:rawr=on:rtra=on_0"
             ,&local_de1);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator(&local_de1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,
             "ott-1_1:6_drc=ordering:av=off:cond=on:fsr=off:nwc=3.0:i=51:si=on:rawr=on:rtra=on_0",
             &local_de2);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_de2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_178,"ott+2_1:1_drc=ordering:fsr=off:gsp=on:i=50:si=on:rawr=on:rtra=on_0",
             &local_de3);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator(&local_de3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_198,
             "ott+10_1:32_drc=ordering:bd=off:fsr=off:newcnf=on:tgt=full:i=100:si=on:rawr=on:rtra=on_0"
             ,&local_de4);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator(&local_de4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b8,
             "ott+10_1:28_drc=ordering:bd=off:bs=on:tgt=ground:i=101:si=on:rawr=on:rtra=on_0",
             &local_de5);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator(&local_de5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d8,"ott+10_1:5_drc=ordering:bd=off:tgt=full:i=99:si=on:rawr=on:rtra=on_0",
             &local_de6);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator(&local_de6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f8,
             "ott+11_2:3_drc=ordering:av=off:fde=unused:nwc=5.0:tgt=ground:i=75:si=on:rawr=on:rtra=on_0"
             ,&local_de7);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator(&local_de7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_218,
             "dis+34_1:32_drc=ordering:abs=on:add=off:bsr=on:gsp=on:sp=weighted_frequency:i=99:si=on:rawr=on:rtra=on_0"
             ,&local_de8);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator(&local_de8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_238,"fmb+10_1:1_drc=ordering:bce=on:i=59:si=on:rawr=on:rtra=on_0",&local_de9);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_de9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_258,"ott+10_1:1_drc=ordering:tgt=ground:i=100:si=on:rawr=on:rtra=on_0",&local_dea
            );
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator(&local_dea);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_278,
             "ott+4_1:1_drc=ordering:av=off:bd=off:nwc=5.0:rp=on:s2a=on:s2at=2.0:slsq=on:slsqc=2:slsql=off:slsqr=1,2:sp=frequency:i=100:si=on:rawr=on:rtra=on_0"
             ,&local_deb);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator(&local_deb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_298,
             "ott+10_1:8_drc=ordering:bsd=on:fsd=on:lcm=predicate:nwc=5.0:s2a=on:s2at=1.5:spb=goal_then_units:i=176:si=on:rawr=on:rtra=on_0"
             ,&local_dec);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator(&local_dec);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2b8,"ott+3_1:1_drc=ordering:gsp=on:lcm=predicate:i=138:si=on:rawr=on:rtra=on_0",
             &local_ded);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator(&local_ded);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2d8,
             "dis+21_1:1_drc=ordering:av=off:er=filter:slsq=on:slsqc=0:slsqr=1,1:sp=frequency:to=lpo:i=498:si=on:rawr=on:rtra=on_0"
             ,&local_dee);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator(&local_dee);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2f8,
             "ott+11_1:1_drc=off:nwc=5.0:slsq=on:slsqc=1:spb=goal_then_units:to=lpo:i=467:si=on:rawr=on:rtra=on_0"
             ,&local_def);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator(&local_def);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_318,
             "ott+10_1:1_drc=ordering:kws=precedence:tgt=ground:i=482:si=on:rawr=on:rtra=on_0",
             &local_df0);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator(&local_df0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_338,"ott+10_1:5_drc=ordering:bd=off:tgt=full:i=500:si=on:rawr=on:rtra=on_0",
             &local_df1);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator(&local_df1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_358,
             "ott+11_2:3_drc=ordering:av=off:fde=unused:nwc=5.0:tgt=ground:i=177:si=on:rawr=on:rtra=on_0"
             ,&local_df2);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_358);
  std::allocator<char>::~allocator(&local_df2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_378,"ott+33_1:4_drc=ordering:s2a=on:tgt=ground:i=439:si=on:rawr=on:rtra=on_0",
             &local_df3);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_378);
  std::allocator<char>::~allocator(&local_df3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_398,
             "ott+10_7:2_bd=preordered:drc=off:fd=preordered:fde=unused:fsr=off:slsq=on:slsqc=2:slsqr=5,8:sp=const_min:spb=units:to=lpo:i=355:si=on:rawr=on:rtra=on_0"
             ,&local_df4);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator(&local_df4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3b8,
             "dis+34_1:32_drc=ordering:abs=on:add=off:bsr=on:gsp=on:sp=weighted_frequency:i=388:si=on:rawr=on:rtra=on_0"
             ,&local_df5);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator(&local_df5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3d8,
             "ott-1_1:6_drc=ordering:av=off:cond=on:fsr=off:nwc=3.0:i=211:si=on:rawr=on:rtra=on_0",
             &local_df6);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator(&local_df6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3f8,
             "dis+22_1:128_drc=ordering:bsd=on:rp=on:slsq=on:slsqc=1:slsqr=1,6:sp=frequency:spb=goal:thsq=on:thsqc=16:thsqd=1:thsql=off:i=90:si=on:rawr=on:rtra=on_0"
             ,&local_df7);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_3f8);
  std::allocator<char>::~allocator(&local_df7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_418,"ott+1_1:2_drc=ordering:i=920:si=on:rawr=on:rtra=on_0",&local_df8);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_418);
  std::allocator<char>::~allocator(&local_df8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_438,"ott+1_1:7_drc=ordering:bd=off:i=934:si=on:rawr=on:rtra=on_0",&local_df9);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator(&local_df9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_458,
             "ott+10_1:50_bsr=unit_only:drc=off:fd=preordered:sp=frequency:i=747:si=on:rawr=on:rtra=on_0"
             ,&local_dfa);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator(&local_dfa);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_478,
             "dis+21_1:1_drc=ordering:av=off:er=filter:slsq=on:slsqc=0:slsqr=1,1:sp=frequency:to=lpo:i=655:si=on:rawr=on:rtra=on_0"
             ,&local_dfb);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_478);
  std::allocator<char>::~allocator(&local_dfb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_498,
             "dis+34_1:32_drc=ordering:abs=on:add=off:bsr=on:gsp=on:sp=weighted_frequency:i=940:si=on:rawr=on:rtra=on_0"
             ,&local_dfc);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_498);
  std::allocator<char>::~allocator(&local_dfc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_4b8,
             "ott+11_4:1_drc=ordering:br=off:fde=none:s2a=on:sd=2:sp=frequency:urr=on:i=981:si=on:rawr=on:rtra=on_0"
             ,&local_dfd);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_4b8);
  std::allocator<char>::~allocator(&local_dfd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_4d8,
             "dis+22_1:128_drc=ordering:bsd=on:rp=on:slsq=on:slsqc=1:slsqr=1,6:sp=frequency:spb=goal:thsq=on:thsqc=16:thsqd=1:thsql=off:i=90:si=on:rawr=on:rtra=on_0"
             ,&local_dfe);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_4d8);
  std::allocator<char>::~allocator(&local_dfe);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_4f8,
             "dis+21_1:1_drc=ordering:av=off:er=filter:slsq=on:slsqc=0:slsqr=1,1:sp=frequency:to=lpo:i=2016:si=on:rawr=on:rtra=on_0"
             ,&local_dff);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_4f8);
  std::allocator<char>::~allocator(&local_dff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_518,"dis+10_1:2_drc=ordering:atotf=0.3:i=3735:si=on:rawr=on:rtra=on_0",&local_e00
            );
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator(&local_e00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_538,
             "ott+11_9:8_drc=ordering:add=large:afp=10:amm=off:fsd=on:fsr=off:lma=on:nm=0:nwc=2.4:s2a=on:s2agt=10:sas=z3:sp=reverse_arity:tha=some:thi=overlap:i=4958:si=on:rawr=on:rtra=on_0"
             ,&local_e01);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_538);
  std::allocator<char>::~allocator(&local_e01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_558,
             "ott+10_1:32_drc=ordering:bd=off:fsr=off:newcnf=on:tgt=full:i=4959:si=on:rawr=on:rtra=on_0"
             ,&local_e02);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_558);
  std::allocator<char>::~allocator(&local_e02);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_578,
             "ott+10_1:1_drc=ordering:kws=precedence:tgt=ground:i=4756:si=on:rawr=on:rtra=on_0",
             &local_e03);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_578);
  std::allocator<char>::~allocator(&local_e03);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_598,
             "ott+3_1:1_drc=ordering:atotf=0.2:fsr=off:kws=precedence:sp=weighted_frequency:spb=intro:tgt=ground:i=4931:si=on:rawr=on:rtra=on_0"
             ,&local_e04);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_598);
  std::allocator<char>::~allocator(&local_e04);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_5b8,
             "ott+11_9:8_drc=ordering:amm=off:bsd=on:etr=on:fsd=on:fsr=off:lma=on:newcnf=on:nm=0:nwc=3.0:s2a=on:s2agt=10:sas=z3:tha=some:i=1824:si=on:rawr=on:rtra=on_0"
             ,&local_e05);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_5b8);
  std::allocator<char>::~allocator(&local_e05);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_5d8,
             "dis+34_1:32_drc=ordering:abs=on:add=off:bsr=on:gsp=on:sp=weighted_frequency:i=2134:si=on:rawr=on:rtra=on_0"
             ,&local_e06);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_5d8);
  std::allocator<char>::~allocator(&local_e06);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_5f8,"ott-1_1:1_drc=ordering:sp=const_frequency:i=2891:si=on:rawr=on:rtra=on_0",
             &local_e07);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_5f8);
  std::allocator<char>::~allocator(&local_e07);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_618,
             "dis+2_1:64_drc=ordering:add=large:bce=on:bd=off:i=4585:si=on:rawr=on:rtra=on_0",
             &local_e08);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_618);
  std::allocator<char>::~allocator(&local_e08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_638,
             "dis+22_1:128_drc=ordering:bsd=on:rp=on:slsq=on:slsqc=1:slsqr=1,6:sp=frequency:spb=goal:thsq=on:thsqc=16:thsqd=1:thsql=off:i=90:si=on:rawr=on:rtra=on_0"
             ,&local_e09);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_638);
  std::allocator<char>::~allocator(&local_e09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_658,
             "dis+21_1:1_drc=ordering:av=off:er=filter:slsq=on:slsqc=0:slsqr=1,1:sp=frequency:to=lpo:i=2016:si=on:rawr=on:rtra=on_0"
             ,&local_e0a);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_658);
  std::allocator<char>::~allocator(&local_e0a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_678,"dis+10_1:2_drc=ordering:atotf=0.3:i=8004:si=on:rawr=on:rtra=on_0",&local_e0b
            );
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_678);
  std::allocator<char>::~allocator(&local_e0b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_698,
             "ott+11_9:8_drc=ordering:add=large:afp=10:amm=off:fsd=on:fsr=off:lma=on:nm=0:nwc=2.4:s2a=on:s2agt=10:sas=z3:sp=reverse_arity:tha=some:thi=overlap:i=9965:si=on:rawr=on:rtra=on_0"
             ,&local_e0c);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_698);
  std::allocator<char>::~allocator(&local_e0c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_6b8,
             "ott+10_1:32_drc=ordering:bd=off:fsr=off:newcnf=on:tgt=full:i=9877:si=on:rawr=on:rtra=on_0"
             ,&local_e0d);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_6b8);
  std::allocator<char>::~allocator(&local_e0d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_6d8,
             "ott+11_9:8_drc=ordering:amm=off:bsd=on:etr=on:fsd=on:fsr=off:lma=on:newcnf=on:nm=0:nwc=3.0:s2a=on:s2agt=10:sas=z3:tha=some:i=1824:si=on:rawr=on:rtra=on_0"
             ,&local_e0e);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_6d8);
  std::allocator<char>::~allocator(&local_e0e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_6f8,
             "dis+2_1:64_drc=ordering:add=large:bce=on:bd=off:i=9989:si=on:rawr=on:rtra=on_0",
             &local_e0f);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_6f8);
  std::allocator<char>::~allocator(&local_e0f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_718,"ott-11_1:32_drc=ordering:i=9707:si=on:rawr=on:rtra=on_0",&local_e10);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_718);
  std::allocator<char>::~allocator(&local_e10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_738,
             "dis+22_1:128_drc=ordering:bsd=on:rp=on:slsq=on:slsqc=1:slsqr=1,6:sp=frequency:spb=goal:thsq=on:thsqc=16:thsqd=1:thsql=off:i=90:si=on:rawr=on:rtra=on_0"
             ,&local_e11);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_738);
  std::allocator<char>::~allocator(&local_e11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_758,
             "ott+3_1:1_drc=ordering:abs=on:anc=none:bs=on:fsr=off:spb=goal_then_units:i=44001:si=on:rawr=on:rtra=on_0"
             ,&local_e12);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_758);
  std::allocator<char>::~allocator(&local_e12);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_778,
             "ott+11_9:8_drc=ordering:add=large:afp=10:amm=off:fsd=on:fsr=off:lma=on:nm=0:nwc=2.4:s2a=on:s2agt=10:sas=z3:sp=reverse_arity:tha=some:thi=overlap:i=4958:si=on:rawr=on:rtra=on_0"
             ,&local_e13);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_778);
  std::allocator<char>::~allocator(&local_e13);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_798,
             "ott+1_27:428_av=off:bsr=unit_only:drc=off:fd=preordered:newcnf=on:nwc=1.5:slsq=on:slsqc=2:slsql=off:slsqr=1,4:sp=reverse_frequency:uwa=one_side_constant:i=35256:si=on:rawr=on:rtra=on_0"
             ,&local_e14);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_798);
  std::allocator<char>::~allocator(&local_e14);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_7b8,
             "dis+1002_1:1_drc=ordering:fde=unused:nwc=10.0:s2a=on:s2at=3.0:sac=on:i=32293:si=on:rawr=on:rtra=on_0"
             ,&local_e15);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_7b8);
  std::allocator<char>::~allocator(&local_e15);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_7d8,
             "ott+21_1:28_drc=ordering:afr=on:anc=all_dependent:bs=on:bsr=unit_only:nicw=on:sp=const_frequency:uhcvi=on:i=37001:si=on:rawr=on:rtra=on_0"
             ,&local_e16);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_7d8);
  std::allocator<char>::~allocator(&local_e16);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_7f8,
             "ott+10_1:32_drc=ordering:bd=off:fsr=off:newcnf=on:tgt=full:i=10187:si=on:rawr=on:rtra=on_0"
             ,&local_e17);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_7f8);
  std::allocator<char>::~allocator(&local_e17);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_818,
             "ott+3_1:1_drc=ordering:atotf=0.2:fsr=off:kws=precedence:sp=weighted_frequency:spb=intro:tgt=ground:i=29337:si=on:rawr=on:rtra=on_0"
             ,&local_e18);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_818);
  std::allocator<char>::~allocator(&local_e18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_838,"fmb+10_1:1_drc=ordering:fmbsr=2.0:nm=4:i=38056:si=on:rawr=on:rtra=on_0",
             &local_e19);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_838);
  std::allocator<char>::~allocator(&local_e19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_858,
             "fmb+10_1:1_drc=ordering:fmbsr=2.0:newcnf=on:nm=2:i=33239:si=on:rawr=on:rtra=on_0",
             &local_e1a);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_858);
  std::allocator<char>::~allocator(&local_e1a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_878,
             "fmb+10_1:1_drc=ordering:fmbas=predicate:gsp=on:nm=2:i=20987:si=on:rawr=on:rtra=on_0",
             &local_e1b);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_878);
  std::allocator<char>::~allocator(&local_e1b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_898,
             "fmb+10_1:1_drc=ordering:bce=on:fmbsr=1.5:nm=4:i=49917:si=on:rawr=on:rtra=on_0",
             &local_e1c);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_898);
  std::allocator<char>::~allocator(&local_e1c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_8b8,
             "dis+2_1:64_drc=ordering:add=large:bce=on:bd=off:i=19144:si=on:rawr=on:rtra=on_0",
             &local_e1d);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_8b8);
  std::allocator<char>::~allocator(&local_e1d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_8d8,
             "dis+10_1:128_drc=ordering:bd=off:lcm=predicate:sac=on:sp=reverse_arity:urr=on:i=27492:si=on:rawr=on:rtra=on_0"
             ,&local_e1e);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_8d8);
  std::allocator<char>::~allocator(&local_e1e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_8f8,"ott-11_1:32_drc=ordering:i=6101:si=on:rawr=on:rtra=on_0",&local_e1f);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_8f8);
  std::allocator<char>::~allocator(&local_e1f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_918,
             "dis+22_1:128_drc=ordering:bsd=on:rp=on:slsq=on:slsqc=1:slsqr=1,6:sp=frequency:spb=goal:thsq=on:thsqc=16:thsqd=1:thsql=off:i=90:si=on:rawr=on:rtra=on_0"
             ,&local_e20);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_918);
  std::allocator<char>::~allocator(&local_e20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_938,
             "ott+11_1:128_drc=ordering:av=off:bd=off:bsr=unit_only:fd=preordered:to=lpo:updr=off:i=91600:si=on:rawr=on:rtra=on_0"
             ,&local_e21);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_938);
  std::allocator<char>::~allocator(&local_e21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_958,
             "ott+11_9:8_drc=ordering:add=large:afp=10:amm=off:fsd=on:fsr=off:lma=on:nm=0:nwc=2.4:s2a=on:s2agt=10:sas=z3:sp=reverse_arity:tha=some:thi=overlap:i=7127:si=on:rawr=on:rtra=on_0"
             ,&local_e22);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_958);
  std::allocator<char>::~allocator(&local_e22);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_978,
             "ott+1_27:428_av=off:bsr=unit_only:drc=off:fd=preordered:newcnf=on:nwc=1.5:slsq=on:slsqc=2:slsql=off:slsqr=1,4:sp=reverse_frequency:uwa=one_side_constant:i=35256:si=on:rawr=on:rtra=on_0"
             ,&local_e23);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_978);
  std::allocator<char>::~allocator(&local_e23);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_998,
             "dis+1002_1:1_drc=ordering:fde=unused:nwc=10.0:s2a=on:s2at=3.0:sac=on:i=32293:si=on:rawr=on:rtra=on_0"
             ,&local_e24);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_998);
  std::allocator<char>::~allocator(&local_e24);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_9b8,
             "ott+3_1:1_drc=ordering:atotf=0.2:fsr=off:kws=precedence:sp=weighted_frequency:spb=intro:tgt=ground:i=29337:si=on:rawr=on:rtra=on_0"
             ,&local_e25);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_9b8);
  std::allocator<char>::~allocator(&local_e25);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_9d8,"fmb+10_1:1_drc=ordering:fmbsr=2.0:nm=4:i=99860:si=on:rawr=on:rtra=on_0",
             &local_e26);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_9d8);
  std::allocator<char>::~allocator(&local_e26);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_9f8,"fmb+10_1:1_drc=ordering:fmbas=expand:i=96985:si=on:rawr=on:rtra=on_0",
             &local_e27);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_9f8);
  std::allocator<char>::~allocator(&local_e27);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a18,
             "fmb+10_1:1_drc=ordering:bce=on:fmbsr=1.47:gsp=on:nm=2:i=99648:si=on:rawr=on:rtra=on_0"
             ,&local_e28);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_a18);
  std::allocator<char>::~allocator(&local_e28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a38,
             "fmb+10_1:1_drc=ordering:bce=on:fmbsr=1.5:nm=4:i=99882:si=on:rawr=on:rtra=on_0",
             &local_e29);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_a38);
  std::allocator<char>::~allocator(&local_e29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a58,
             "fmb+10_1:1_drc=ordering:bce=on:fmbas=predicate:fmbsr=1.5:fmbsso=preprocessed_usage:nm=4:i=99913:si=on:rawr=on:rtra=on_0"
             ,&local_e2a);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_a58);
  std::allocator<char>::~allocator(&local_e2a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a78,
             "dis+10_1:128_drc=ordering:bd=off:lcm=predicate:sac=on:sp=reverse_arity:urr=on:i=28201:si=on:rawr=on:rtra=on_0"
             ,&local_e2b);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_a78);
  std::allocator<char>::~allocator(&local_e2b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a98,"ott-11_1:32_drc=ordering:i=9707:si=on:rawr=on:rtra=on_0",&local_e2c);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_a98);
  std::allocator<char>::~allocator(&local_e2c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_ab8,
             "ott+11_1:128_drc=ordering:av=off:bd=off:bsr=unit_only:fd=preordered:to=lpo:updr=off:i=144582:si=on:rawr=on:rtra=on_0"
             ,&local_e2d);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_ab8);
  std::allocator<char>::~allocator(&local_e2d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_ad8,
             "ott+1_27:428_av=off:bsr=unit_only:drc=off:fd=preordered:newcnf=on:nwc=1.5:slsq=on:slsqc=2:slsql=off:slsqr=1,4:sp=reverse_frequency:uwa=one_side_constant:i=35256:si=on:rawr=on:rtra=on_0"
             ,&local_e2e);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_ad8);
  std::allocator<char>::~allocator(&local_e2e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_af8,
             "dis+1002_1:1_drc=ordering:fde=unused:nwc=10.0:s2a=on:s2at=3.0:sac=on:i=104647:si=on:rawr=on:rtra=on_0"
             ,&local_e2f);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_af8);
  std::allocator<char>::~allocator(&local_e2f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b18,"fmb+10_1:1_drc=ordering:fmbsr=2.0:nm=4:i=146146:si=on:rawr=on:rtra=on_0",
             &local_e30);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_b18);
  std::allocator<char>::~allocator(&local_e30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b38,"fmb+10_1:1_drc=ordering:fmbas=expand:i=112867:si=on:rawr=on:rtra=on_0",
             &local_e31);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_b38);
  std::allocator<char>::~allocator(&local_e31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b58,
             "fmb+10_1:1_drc=ordering:bce=on:fmbsr=1.47:gsp=on:nm=2:i=133500:si=on:rawr=on:rtra=on_0"
             ,&local_e32);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_b58);
  std::allocator<char>::~allocator(&local_e32);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b78,"fmb+10_1:1_drc=ordering:fmbsr=2.0:ins=2:i=145423:si=on:rawr=on:rtra=on_0",
             &local_e33);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_b78);
  std::allocator<char>::~allocator(&local_e33);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b98,
             "fmb+10_1:1_drc=ordering:bce=on:fmbsr=1.5:nm=4:i=147928:si=on:rawr=on:rtra=on_0",
             &local_e34);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_b98);
  std::allocator<char>::~allocator(&local_e34);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_bb8,
             "ott+10_1:1_drc=ordering:bs=on:fsr=off:gs=on:i=146184:si=on:rawr=on:rtra=on_0",
             &local_e35);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_bb8);
  std::allocator<char>::~allocator(&local_e35);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_bd8,
             "ott+11_1:128_drc=ordering:av=off:bd=off:bsr=unit_only:fd=preordered:to=lpo:updr=off:i=260001:si=on:rawr=on:rtra=on_0"
             ,&local_e36);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_bd8);
  std::allocator<char>::~allocator(&local_e36);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_bf8,"ott+10_1:1_drc=ordering:i=496751:si=on:rawr=on:rtra=on_0",&local_e37);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_bf8);
  std::allocator<char>::~allocator(&local_e37);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c18,
             "ott+4_1:1_drc=ordering:atotf=0.5:bce=on:ins=1:sp=frequency:spb=units:i=325642:si=on:rawr=on:rtra=on_0"
             ,&local_e38);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_c18);
  std::allocator<char>::~allocator(&local_e38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c38,
             "ott+10_1:1_drc=ordering:kws=precedence:tgt=ground:i=480001:si=on:rawr=on:rtra=on_0",
             &local_e39);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_c38);
  std::allocator<char>::~allocator(&local_e39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c58,"fmb+10_1:1_drc=ordering:bce=on:i=479034:si=on:rawr=on:rtra=on_0",&local_e3a)
  ;
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_c58);
  std::allocator<char>::~allocator(&local_e3a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c78,
             "fmb+10_1:1_drc=ordering:bce=on:fmbsr=1.47:gsp=on:nm=2:i=452948:si=on:rawr=on:rtra=on_0"
             ,&local_e3b);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_c78);
  std::allocator<char>::~allocator(&local_e3b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c98,
             "ott+10_1:1_drc=ordering:bs=on:fsr=off:gs=on:i=262660:si=on:rawr=on:rtra=on_0",
             &local_e3c);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_c98);
  std::allocator<char>::~allocator(&local_e3c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_cb8,
             "dis+1010_1:4_drc=ordering:aac=none:abs=on:atotf=0.5:avsq=on:avsqc=2:avsqr=215,247:bsd=on:erd=off:fde=none:gve=cautious:newcnf=on:nwc=5.0:rnwc=on:rp=on:sac=on:sas=z3:sp=const_min:tgt=ground:thsq=on:thsqc=64:thsqr=1,4:i=255558:si=on:rawr=on:rtra=on_0"
             ,&local_e3d);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_cb8);
  std::allocator<char>::~allocator(&local_e3d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_cd8,
             "ott+11_1:128_drc=ordering:av=off:bd=off:bsr=unit_only:fd=preordered:to=lpo:updr=off:i=260001:si=on:rawr=on:rtra=on_0"
             ,&local_e3e);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_cd8);
  std::allocator<char>::~allocator(&local_e3e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_cf8,"ott+10_1:1_drc=ordering:i=305496:si=on:rawr=on:rtra=on_0",&local_e3f);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_cf8);
  std::allocator<char>::~allocator(&local_e3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d18,
             "ott+10_1:1_drc=ordering:kws=precedence:tgt=ground:i=480001:si=on:rawr=on:rtra=on_0",
             &local_e40);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_d18);
  std::allocator<char>::~allocator(&local_e40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d38,"fmb+10_1:1_drc=ordering:bce=on:i=467380:si=on:rawr=on:rtra=on_0",&local_e41)
  ;
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_d38);
  std::allocator<char>::~allocator(&local_e41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d58,
             "fmb+10_1:1_drc=ordering:bce=on:fmbsr=1.47:gsp=on:nm=2:i=492000:si=on:rawr=on:rtra=on_0"
             ,&local_e42);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_d58);
  std::allocator<char>::~allocator(&local_e42);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d78,
             "dis+1010_1:4_drc=ordering:aac=none:abs=on:atotf=0.5:avsq=on:avsqc=2:avsqr=215,247:bsd=on:erd=off:fde=none:gve=cautious:newcnf=on:nwc=5.0:rnwc=on:rp=on:sac=on:sas=z3:sp=const_min:tgt=ground:thsq=on:thsqc=64:thsqr=1,4:i=255558:si=on:rawr=on:rtra=on_0"
             ,&local_e43);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_d78);
  std::allocator<char>::~allocator(&local_e43);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d98,"ott+10_1:1_drc=ordering:i=496751:si=on:rawr=on:rtra=on_0",&local_e44);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_d98);
  std::allocator<char>::~allocator(&local_e44);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_db8,
             "ott+10_1:1_drc=ordering:kws=precedence:tgt=ground:i=285611:si=on:rawr=on:rtra=on_0",
             &local_e45);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_db8);
  std::allocator<char>::~allocator(&local_e45);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_dd8,
             "fmb+10_1:1_drc=ordering:bce=on:fmbsr=1.47:gsp=on:nm=2:i=492000:si=on:rawr=on:rtra=on_0"
             ,&local_e46);
  ::Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push(in_stack_fffffffffffff198,in_stack_fffffffffffff1a0);
  std::__cxx11::string::~string(local_dd8);
  std::allocator<char>::~allocator(&local_e46);
  return;
}

Assistant:

void Schedules::getSnakeTptpSatSchedule(const Shell::Property& property, Schedule& quick) {
  // problemsFNT.txt
  // Champion singleton-schedule for 200000Mi
   quick.push("fmb+10_1:1_drc=ordering:bce=on:fmbsr=1.5:nm=4:i=191324:si=on:rawr=on:rtra=on_0");
  // Improves by expected 1856.5193556018971 probs costing 191323 Mi
  // Sub-schedule for 50Mi strat cap / 400Mi overall limit
   quick.push("ott+10_1:32_drc=ordering:abs=on:br=off:urr=ec_only:i=50:si=on:rawr=on:rtra=on_0");
   quick.push("ott+4_1:1_drc=ordering:av=off:bd=off:nwc=5.0:s2a=on:s2at=2.0:slsq=on:slsqc=2:slsql=off:slsqr=1,2:sp=frequency:i=37:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:32_drc=ordering:bd=off:fsr=off:newcnf=on:tgt=full:i=51:si=on:rawr=on:rtra=on_0");
   quick.push("ott+33_1:4_drc=ordering:s2a=on:tgt=ground:i=51:si=on:rawr=on:rtra=on_0");
   quick.push("dis+34_1:32_drc=ordering:abs=on:add=off:bsr=on:gsp=on:sp=weighted_frequency:i=48:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:fmbsr=2.0:nm=4:i=51:si=on:rawr=on:rtra=on_0");
   quick.push("dis+10_1:1_drc=ordering:fsd=on:sp=occurrence:i=7:si=on:rawr=on:rtra=on_0");
   quick.push("dis+2_1:64_drc=ordering:add=large:bce=on:bd=off:i=2:si=on:rawr=on:rtra=on_0");
   quick.push("ott-1_1:6_drc=ordering:av=off:cond=on:fsr=off:nwc=3.0:i=51:si=on:rawr=on:rtra=on_0");
   quick.push("ott+2_1:1_drc=ordering:fsr=off:gsp=on:i=50:si=on:rawr=on:rtra=on_0");
  // Improves by expected 95.35596882712122 probs costing 388 Mi
  // Sub-schedule for 100Mi strat cap / 800Mi overall limit
   quick.push("ott+10_1:32_drc=ordering:bd=off:fsr=off:newcnf=on:tgt=full:i=100:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:28_drc=ordering:bd=off:bs=on:tgt=ground:i=101:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:5_drc=ordering:bd=off:tgt=full:i=99:si=on:rawr=on:rtra=on_0");
   quick.push("ott+11_2:3_drc=ordering:av=off:fde=unused:nwc=5.0:tgt=ground:i=75:si=on:rawr=on:rtra=on_0");
   quick.push("dis+34_1:32_drc=ordering:abs=on:add=off:bsr=on:gsp=on:sp=weighted_frequency:i=99:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:bce=on:i=59:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:1_drc=ordering:tgt=ground:i=100:si=on:rawr=on:rtra=on_0");
   quick.push("ott+4_1:1_drc=ordering:av=off:bd=off:nwc=5.0:rp=on:s2a=on:s2at=2.0:slsq=on:slsqc=2:slsql=off:slsqr=1,2:sp=frequency:i=100:si=on:rawr=on:rtra=on_0");
  // Improves by expected 12.8888583651196 probs costing 792 Mi
  // Sub-schedule for 500Mi strat cap / 4000Mi overall limit
   quick.push("ott+10_1:8_drc=ordering:bsd=on:fsd=on:lcm=predicate:nwc=5.0:s2a=on:s2at=1.5:spb=goal_then_units:i=176:si=on:rawr=on:rtra=on_0");
   quick.push("ott+3_1:1_drc=ordering:gsp=on:lcm=predicate:i=138:si=on:rawr=on:rtra=on_0");
   quick.push("dis+21_1:1_drc=ordering:av=off:er=filter:slsq=on:slsqc=0:slsqr=1,1:sp=frequency:to=lpo:i=498:si=on:rawr=on:rtra=on_0");
   quick.push("ott+11_1:1_drc=off:nwc=5.0:slsq=on:slsqc=1:spb=goal_then_units:to=lpo:i=467:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:1_drc=ordering:kws=precedence:tgt=ground:i=482:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:5_drc=ordering:bd=off:tgt=full:i=500:si=on:rawr=on:rtra=on_0");
   quick.push("ott+11_2:3_drc=ordering:av=off:fde=unused:nwc=5.0:tgt=ground:i=177:si=on:rawr=on:rtra=on_0");
   quick.push("ott+33_1:4_drc=ordering:s2a=on:tgt=ground:i=439:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_7:2_bd=preordered:drc=off:fd=preordered:fde=unused:fsr=off:slsq=on:slsqc=2:slsqr=5,8:sp=const_min:spb=units:to=lpo:i=355:si=on:rawr=on:rtra=on_0");
   quick.push("dis+34_1:32_drc=ordering:abs=on:add=off:bsr=on:gsp=on:sp=weighted_frequency:i=388:si=on:rawr=on:rtra=on_0");
   quick.push("ott-1_1:6_drc=ordering:av=off:cond=on:fsr=off:nwc=3.0:i=211:si=on:rawr=on:rtra=on_0");
   quick.push("dis+22_1:128_drc=ordering:bsd=on:rp=on:slsq=on:slsqc=1:slsqr=1,6:sp=frequency:spb=goal:thsq=on:thsqc=16:thsqd=1:thsql=off:i=90:si=on:rawr=on:rtra=on_0");
  // Improves by expected 27.24796872611255 probs costing 3976 Mi
  // Sub-schedule for 1000Mi strat cap / 8000Mi overall limit
   quick.push("ott+1_1:2_drc=ordering:i=920:si=on:rawr=on:rtra=on_0");
   quick.push("ott+1_1:7_drc=ordering:bd=off:i=934:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:50_bsr=unit_only:drc=off:fd=preordered:sp=frequency:i=747:si=on:rawr=on:rtra=on_0");
   quick.push("dis+21_1:1_drc=ordering:av=off:er=filter:slsq=on:slsqc=0:slsqr=1,1:sp=frequency:to=lpo:i=655:si=on:rawr=on:rtra=on_0");
   quick.push("dis+34_1:32_drc=ordering:abs=on:add=off:bsr=on:gsp=on:sp=weighted_frequency:i=940:si=on:rawr=on:rtra=on_0");
   quick.push("ott+11_4:1_drc=ordering:br=off:fde=none:s2a=on:sd=2:sp=frequency:urr=on:i=981:si=on:rawr=on:rtra=on_0");
   quick.push("dis+22_1:128_drc=ordering:bsd=on:rp=on:slsq=on:slsqc=1:slsqr=1,6:sp=frequency:spb=goal:thsq=on:thsqc=16:thsqd=1:thsql=off:i=90:si=on:rawr=on:rtra=on_0");
  // Improves by expected 11.014686867779822 probs costing 5327 Mi
  // Sub-schedule for 5000Mi strat cap / 40000Mi overall limit
   quick.push("dis+21_1:1_drc=ordering:av=off:er=filter:slsq=on:slsqc=0:slsqr=1,1:sp=frequency:to=lpo:i=2016:si=on:rawr=on:rtra=on_0");
   quick.push("dis+10_1:2_drc=ordering:atotf=0.3:i=3735:si=on:rawr=on:rtra=on_0");
   quick.push("ott+11_9:8_drc=ordering:add=large:afp=10:amm=off:fsd=on:fsr=off:lma=on:nm=0:nwc=2.4:s2a=on:s2agt=10:sas=z3:sp=reverse_arity:tha=some:thi=overlap:i=4958:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:32_drc=ordering:bd=off:fsr=off:newcnf=on:tgt=full:i=4959:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:1_drc=ordering:kws=precedence:tgt=ground:i=4756:si=on:rawr=on:rtra=on_0");
   quick.push("ott+3_1:1_drc=ordering:atotf=0.2:fsr=off:kws=precedence:sp=weighted_frequency:spb=intro:tgt=ground:i=4931:si=on:rawr=on:rtra=on_0");
   quick.push("ott+11_9:8_drc=ordering:amm=off:bsd=on:etr=on:fsd=on:fsr=off:lma=on:newcnf=on:nm=0:nwc=3.0:s2a=on:s2agt=10:sas=z3:tha=some:i=1824:si=on:rawr=on:rtra=on_0");
   quick.push("dis+34_1:32_drc=ordering:abs=on:add=off:bsr=on:gsp=on:sp=weighted_frequency:i=2134:si=on:rawr=on:rtra=on_0");
   quick.push("ott-1_1:1_drc=ordering:sp=const_frequency:i=2891:si=on:rawr=on:rtra=on_0");
   quick.push("dis+2_1:64_drc=ordering:add=large:bce=on:bd=off:i=4585:si=on:rawr=on:rtra=on_0");
   quick.push("dis+22_1:128_drc=ordering:bsd=on:rp=on:slsq=on:slsqc=1:slsqr=1,6:sp=frequency:spb=goal:thsq=on:thsqc=16:thsqd=1:thsql=off:i=90:si=on:rawr=on:rtra=on_0");
  // Improves by expected 19.448144622151943 probs costing 36935 Mi
  // Sub-schedule for 10000Mi strat cap / 80000Mi overall limit
   quick.push("dis+21_1:1_drc=ordering:av=off:er=filter:slsq=on:slsqc=0:slsqr=1,1:sp=frequency:to=lpo:i=2016:si=on:rawr=on:rtra=on_0");
   quick.push("dis+10_1:2_drc=ordering:atotf=0.3:i=8004:si=on:rawr=on:rtra=on_0");
   quick.push("ott+11_9:8_drc=ordering:add=large:afp=10:amm=off:fsd=on:fsr=off:lma=on:nm=0:nwc=2.4:s2a=on:s2agt=10:sas=z3:sp=reverse_arity:tha=some:thi=overlap:i=9965:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:32_drc=ordering:bd=off:fsr=off:newcnf=on:tgt=full:i=9877:si=on:rawr=on:rtra=on_0");
   quick.push("ott+11_9:8_drc=ordering:amm=off:bsd=on:etr=on:fsd=on:fsr=off:lma=on:newcnf=on:nm=0:nwc=3.0:s2a=on:s2agt=10:sas=z3:tha=some:i=1824:si=on:rawr=on:rtra=on_0");
   quick.push("dis+2_1:64_drc=ordering:add=large:bce=on:bd=off:i=9989:si=on:rawr=on:rtra=on_0");
   quick.push("ott-11_1:32_drc=ordering:i=9707:si=on:rawr=on:rtra=on_0");
   quick.push("dis+22_1:128_drc=ordering:bsd=on:rp=on:slsq=on:slsqc=1:slsqr=1,6:sp=frequency:spb=goal:thsq=on:thsqc=16:thsqd=1:thsql=off:i=90:si=on:rawr=on:rtra=on_0");
  // Improves by expected 9.100420630309813 probs costing 61365 Mi
  // Sub-schedule for 50000Mi strat cap / 400000Mi overall limit
   quick.push("ott+3_1:1_drc=ordering:abs=on:anc=none:bs=on:fsr=off:spb=goal_then_units:i=44001:si=on:rawr=on:rtra=on_0");
   quick.push("ott+11_9:8_drc=ordering:add=large:afp=10:amm=off:fsd=on:fsr=off:lma=on:nm=0:nwc=2.4:s2a=on:s2agt=10:sas=z3:sp=reverse_arity:tha=some:thi=overlap:i=4958:si=on:rawr=on:rtra=on_0");
   quick.push("ott+1_27:428_av=off:bsr=unit_only:drc=off:fd=preordered:newcnf=on:nwc=1.5:slsq=on:slsqc=2:slsql=off:slsqr=1,4:sp=reverse_frequency:uwa=one_side_constant:i=35256:si=on:rawr=on:rtra=on_0");
   quick.push("dis+1002_1:1_drc=ordering:fde=unused:nwc=10.0:s2a=on:s2at=3.0:sac=on:i=32293:si=on:rawr=on:rtra=on_0");
   quick.push("ott+21_1:28_drc=ordering:afr=on:anc=all_dependent:bs=on:bsr=unit_only:nicw=on:sp=const_frequency:uhcvi=on:i=37001:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:32_drc=ordering:bd=off:fsr=off:newcnf=on:tgt=full:i=10187:si=on:rawr=on:rtra=on_0");
   quick.push("ott+3_1:1_drc=ordering:atotf=0.2:fsr=off:kws=precedence:sp=weighted_frequency:spb=intro:tgt=ground:i=29337:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:fmbsr=2.0:nm=4:i=38056:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:fmbsr=2.0:newcnf=on:nm=2:i=33239:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:fmbas=predicate:gsp=on:nm=2:i=20987:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:bce=on:fmbsr=1.5:nm=4:i=49917:si=on:rawr=on:rtra=on_0");
   quick.push("dis+2_1:64_drc=ordering:add=large:bce=on:bd=off:i=19144:si=on:rawr=on:rtra=on_0");
   quick.push("dis+10_1:128_drc=ordering:bd=off:lcm=predicate:sac=on:sp=reverse_arity:urr=on:i=27492:si=on:rawr=on:rtra=on_0");
   quick.push("ott-11_1:32_drc=ordering:i=6101:si=on:rawr=on:rtra=on_0");
   quick.push("dis+22_1:128_drc=ordering:bsd=on:rp=on:slsq=on:slsqc=1:slsqr=1,6:sp=frequency:spb=goal:thsq=on:thsqc=16:thsqd=1:thsql=off:i=90:si=on:rawr=on:rtra=on_0");
  // Improves by expected 13.362600076988887 probs costing 398190 Mi
  // Sub-schedule for 100000Mi strat cap / 800000Mi overall limit
   quick.push("ott+11_1:128_drc=ordering:av=off:bd=off:bsr=unit_only:fd=preordered:to=lpo:updr=off:i=91600:si=on:rawr=on:rtra=on_0");
   quick.push("ott+11_9:8_drc=ordering:add=large:afp=10:amm=off:fsd=on:fsr=off:lma=on:nm=0:nwc=2.4:s2a=on:s2agt=10:sas=z3:sp=reverse_arity:tha=some:thi=overlap:i=7127:si=on:rawr=on:rtra=on_0");
   quick.push("ott+1_27:428_av=off:bsr=unit_only:drc=off:fd=preordered:newcnf=on:nwc=1.5:slsq=on:slsqc=2:slsql=off:slsqr=1,4:sp=reverse_frequency:uwa=one_side_constant:i=35256:si=on:rawr=on:rtra=on_0");
   quick.push("dis+1002_1:1_drc=ordering:fde=unused:nwc=10.0:s2a=on:s2at=3.0:sac=on:i=32293:si=on:rawr=on:rtra=on_0");
   quick.push("ott+3_1:1_drc=ordering:atotf=0.2:fsr=off:kws=precedence:sp=weighted_frequency:spb=intro:tgt=ground:i=29337:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:fmbsr=2.0:nm=4:i=99860:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:fmbas=expand:i=96985:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:bce=on:fmbsr=1.47:gsp=on:nm=2:i=99648:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:bce=on:fmbsr=1.5:nm=4:i=99882:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:bce=on:fmbas=predicate:fmbsr=1.5:fmbsso=preprocessed_usage:nm=4:i=99913:si=on:rawr=on:rtra=on_0");
   quick.push("dis+10_1:128_drc=ordering:bd=off:lcm=predicate:sac=on:sp=reverse_arity:urr=on:i=28201:si=on:rawr=on:rtra=on_0");
   quick.push("ott-11_1:32_drc=ordering:i=9707:si=on:rawr=on:rtra=on_0");
  // Improves by expected 6.347485436212229 probs costing 729797 Mi
  // Sub-schedule for 150000Mi strat cap / 1200000Mi overall limit
   quick.push("ott+11_1:128_drc=ordering:av=off:bd=off:bsr=unit_only:fd=preordered:to=lpo:updr=off:i=144582:si=on:rawr=on:rtra=on_0");
   quick.push("ott+1_27:428_av=off:bsr=unit_only:drc=off:fd=preordered:newcnf=on:nwc=1.5:slsq=on:slsqc=2:slsql=off:slsqr=1,4:sp=reverse_frequency:uwa=one_side_constant:i=35256:si=on:rawr=on:rtra=on_0");
   quick.push("dis+1002_1:1_drc=ordering:fde=unused:nwc=10.0:s2a=on:s2at=3.0:sac=on:i=104647:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:fmbsr=2.0:nm=4:i=146146:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:fmbas=expand:i=112867:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:bce=on:fmbsr=1.47:gsp=on:nm=2:i=133500:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:fmbsr=2.0:ins=2:i=145423:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:bce=on:fmbsr=1.5:nm=4:i=147928:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:1_drc=ordering:bs=on:fsr=off:gs=on:i=146184:si=on:rawr=on:rtra=on_0");
  // Improves by expected 5.220673651207569 probs costing 1116524 Mi
  // Sub-schedule for 500000Mi strat cap / 4000000Mi overall limit
   quick.push("ott+11_1:128_drc=ordering:av=off:bd=off:bsr=unit_only:fd=preordered:to=lpo:updr=off:i=260001:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:1_drc=ordering:i=496751:si=on:rawr=on:rtra=on_0");
   quick.push("ott+4_1:1_drc=ordering:atotf=0.5:bce=on:ins=1:sp=frequency:spb=units:i=325642:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:1_drc=ordering:kws=precedence:tgt=ground:i=480001:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:bce=on:i=479034:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:bce=on:fmbsr=1.47:gsp=on:nm=2:i=452948:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:1_drc=ordering:bs=on:fsr=off:gs=on:i=262660:si=on:rawr=on:rtra=on_0");
   quick.push("dis+1010_1:4_drc=ordering:aac=none:abs=on:atotf=0.5:avsq=on:avsqc=2:avsqr=215,247:bsd=on:erd=off:fde=none:gve=cautious:newcnf=on:nwc=5.0:rnwc=on:rp=on:sac=on:sas=z3:sp=const_min:tgt=ground:thsq=on:thsqc=64:thsqr=1,4:i=255558:si=on:rawr=on:rtra=on_0");
  // Improves by expected 23.026595026749764 probs costing 3012587 Mi
  // Sub-schedule for 500000Mi strat cap / 4000000Mi overall limit
   quick.push("ott+11_1:128_drc=ordering:av=off:bd=off:bsr=unit_only:fd=preordered:to=lpo:updr=off:i=260001:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:1_drc=ordering:i=305496:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:1_drc=ordering:kws=precedence:tgt=ground:i=480001:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:bce=on:i=467380:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:bce=on:fmbsr=1.47:gsp=on:nm=2:i=492000:si=on:rawr=on:rtra=on_0");
   quick.push("dis+1010_1:4_drc=ordering:aac=none:abs=on:atotf=0.5:avsq=on:avsqc=2:avsqr=215,247:bsd=on:erd=off:fde=none:gve=cautious:newcnf=on:nwc=5.0:rnwc=on:rp=on:sac=on:sas=z3:sp=const_min:tgt=ground:thsq=on:thsqc=64:thsqr=1,4:i=255558:si=on:rawr=on:rtra=on_0");
  // Improves by expected 1.2113310912171895 probs costing 2260430 Mi
  // Sub-schedule for 500000Mi strat cap / 4000000Mi overall limit
   quick.push("ott+10_1:1_drc=ordering:i=496751:si=on:rawr=on:rtra=on_0");
   quick.push("ott+10_1:1_drc=ordering:kws=precedence:tgt=ground:i=285611:si=on:rawr=on:rtra=on_0");
   quick.push("fmb+10_1:1_drc=ordering:bce=on:fmbsr=1.47:gsp=on:nm=2:i=492000:si=on:rawr=on:rtra=on_0");
  // Improves by expected 0.4363593202030057 probs costing 1274359 Mi
  // Overall score 2081.1804482430707 probs on average / budget 9091993 Mi
}